

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_utf_len(char *str,int len)

{
  int iVar1;
  int iVar2;
  int iVar3;
  nk_rune unicode;
  nk_rune local_2c;
  
  if (str == (char *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x1f0b,"int nk_utf_len(const char *, int)");
  }
  iVar2 = 0;
  if ((len != 0) && (iVar1 = nk_utf_decode(str,&local_2c,len), iVar2 = 0, 0 < len && iVar1 != 0)) {
    iVar3 = 0;
    iVar2 = 0;
    do {
      iVar3 = iVar3 + iVar1;
      iVar2 = iVar2 + 1;
      iVar1 = nk_utf_decode(str + iVar3,&local_2c,len - iVar3);
      if (iVar1 == 0) {
        return iVar2;
      }
    } while (iVar3 < len);
  }
  return iVar2;
}

Assistant:

NK_API int
nk_utf_len(const char *str, int len)
{
    const char *text;
    int glyphs = 0;
    int text_len;
    int glyph_len;
    int src_len = 0;
    nk_rune unicode;

    NK_ASSERT(str);
    if (!str || !len) return 0;

    text = str;
    text_len = len;
    glyph_len = nk_utf_decode(text, &unicode, text_len);
    while (glyph_len && src_len < len) {
        glyphs++;
        src_len = src_len + glyph_len;
        glyph_len = nk_utf_decode(text + src_len, &unicode, text_len - src_len);
    }
    return glyphs;
}